

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O3

void ryg_dxt::sInitDXT(void)

{
  sInt i;
  long lVar1;
  int iVar2;
  
  Expand5._0_8_ = 0x3931292118100800;
  Expand5._8_8_ = 0x7b736b635a524a42;
  Expand5._16_8_ = 0xbdb5ada59c948c84;
  Expand5._24_8_ = 0xfff7efe7ded6cec6;
  Expand6._0_8_ = 0x1c1814100c080400;
  Expand6._8_8_ = 0x3c3834302c282420;
  Expand6._16_8_ = 0x5d5955514d494541;
  Expand6._24_8_ = 0x7d7975716d696561;
  Expand6._32_8_ = 0x9e9a96928e8a8682;
  Expand6._40_8_ = 0xbebab6b2aeaaa6a2;
  Expand6._48_8_ = 0xdfdbd7d3cfcbc7c3;
  Expand6._56_8_ = 0xfffbf7f3efebe7e3;
  lVar1 = 0;
  do {
    iVar2 = 8;
    if (8 < (int)lVar1) {
      iVar2 = (int)lVar1;
    }
    if (0x106 < iVar2) {
      iVar2 = 0x107;
    }
    (&QuantRBTab)[lVar1] = Expand5[(iVar2 * 0x1f + (iVar2 * 0x1f - 0x78U >> 8)) - 0x78 >> 8];
    (&QuantGTab)[lVar1] = Expand6[((iVar2 * 0x3f - 0x178U >> 8) + iVar2 * 0x3f) - 0x178 >> 8];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x110);
  PrepareOptTable4(OMatch5,Expand5,0x20);
  PrepareOptTable4(OMatch6,Expand6,0x40);
  PrepareOptTable3(OMatch5_3,Expand5,0x20);
  PrepareOptTable3(OMatch6_3,Expand6,0x40);
  return;
}

Assistant:

void sInitDXT() {
  for (sInt i = 0; i < 32; i++)
    Expand5[i] = (i << 3) | (i >> 2);

  for (sInt i = 0; i < 64; i++)
    Expand6[i] = (i << 2) | (i >> 4);

  for (sInt i = 0; i < 256 + 16; i++) {
    sInt v = sClamp(i - 8, 0, 255);
    QuantRBTab[i] = Expand5[Mul8Bit(v, 31)];
    QuantGTab[i] = Expand6[Mul8Bit(v, 63)];
  }

  PrepareOptTable4(&OMatch5[0][0], Expand5, 32);
  PrepareOptTable4(&OMatch6[0][0], Expand6, 64);

  PrepareOptTable3(&OMatch5_3[0][0], Expand5, 32);
  PrepareOptTable3(&OMatch6_3[0][0], Expand6, 64);
}